

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blake3_portable.c
# Opt level: O1

void blake3_compress_xof_portable
               (uint32_t *cv,uint8_t *block,uint8_t block_len,uint64_t counter,uint8_t flags,
               uint8_t *out)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  undefined7 in_register_00000011;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  undefined7 in_register_00000081;
  uint uVar31;
  uint uVar32;
  uint uVar33;
  uint uVar34;
  uint uVar35;
  uint uVar36;
  
  iVar1 = *(int *)block;
  iVar2 = *(int *)(block + 8);
  iVar3 = *(int *)(block + 0x10);
  uVar22 = *cv + iVar1 + cv[4];
  uVar31 = uVar22 ^ (uint)counter;
  uVar28 = uVar31 >> 0x10 | uVar31 << 0x10;
  uVar32 = uVar28 + 0x6a09e667 ^ cv[4];
  uVar29 = cv[1] + iVar2 + cv[5];
  uVar31 = (uint)(counter >> 0x20) ^ uVar29;
  uVar17 = uVar31 >> 0x10 | uVar31 << 0x10;
  uVar23 = uVar17 + 0xbb67ae85 ^ cv[5];
  uVar18 = cv[2] + iVar3 + cv[6];
  uVar31 = (uint)CONCAT71(in_register_00000011,block_len) ^ uVar18;
  uVar19 = uVar31 >> 0x10 | uVar31 << 0x10;
  uVar20 = uVar19 + 0x3c6ef372 ^ cv[6];
  iVar4 = *(int *)(block + 0x18);
  uVar21 = cv[3] + iVar4 + cv[7];
  uVar31 = (uint)CONCAT71(in_register_00000081,flags) ^ uVar21;
  uVar31 = uVar31 >> 0x10 | uVar31 << 0x10;
  uVar26 = uVar31 + 0xa54ff53a ^ cv[7];
  iVar5 = *(int *)(block + 4);
  iVar6 = *(int *)(block + 0xc);
  iVar7 = *(int *)(block + 0x14);
  iVar8 = *(int *)(block + 0x1c);
  iVar9 = *(int *)(block + 0x20);
  iVar10 = *(int *)(block + 0x24);
  iVar11 = *(int *)(block + 0x28);
  iVar12 = *(int *)(block + 0x2c);
  iVar13 = *(int *)(block + 0x30);
  iVar14 = *(int *)(block + 0x34);
  iVar15 = *(int *)(block + 0x38);
  iVar16 = *(int *)(block + 0x3c);
  uVar24 = uVar32 >> 0xc | uVar32 << 0x14;
  uVar32 = uVar22 + iVar5 + uVar24;
  uVar22 = uVar32 ^ uVar28;
  uVar34 = uVar22 >> 8 | uVar22 << 0x18;
  uVar28 = uVar34 + 0x6a09e667 + uVar28;
  uVar24 = uVar24 ^ uVar28;
  uVar25 = uVar24 >> 7 | uVar24 << 0x19;
  uVar22 = uVar23 >> 0xc | uVar23 << 0x14;
  uVar30 = uVar29 + iVar6 + uVar22;
  uVar23 = uVar30 ^ uVar17;
  uVar33 = uVar23 >> 8 | uVar23 << 0x18;
  uVar17 = uVar33 + 0xbb67ae85 + uVar17;
  uVar22 = uVar22 ^ uVar17;
  uVar24 = uVar22 >> 7 | uVar22 << 0x19;
  uVar20 = uVar20 >> 0xc | uVar20 << 0x14;
  uVar22 = uVar18 + iVar7 + uVar20;
  uVar18 = uVar22 ^ uVar19;
  uVar18 = uVar18 >> 8 | uVar18 << 0x18;
  uVar19 = uVar18 + 0x3c6ef372 + uVar19;
  uVar20 = uVar20 ^ uVar19;
  uVar29 = uVar20 >> 7 | uVar20 << 0x19;
  uVar20 = uVar26 >> 0xc | uVar26 << 0x14;
  uVar23 = uVar21 + iVar8 + uVar20;
  uVar21 = uVar23 ^ uVar31;
  uVar21 = uVar21 >> 8 | uVar21 << 0x18;
  uVar31 = uVar21 + 0xa54ff53a + uVar31;
  uVar20 = uVar20 ^ uVar31;
  uVar27 = uVar20 >> 7 | uVar20 << 0x19;
  uVar20 = uVar32 + iVar9 + uVar24;
  uVar21 = uVar21 ^ uVar20;
  uVar21 = uVar21 >> 0x10 | uVar21 << 0x10;
  uVar19 = uVar19 + uVar21;
  uVar24 = uVar24 ^ uVar19;
  uVar32 = uVar24 >> 0xc | uVar24 << 0x14;
  uVar26 = uVar20 + iVar10 + uVar32;
  uVar21 = uVar21 ^ uVar26;
  uVar21 = uVar21 >> 8 | uVar21 << 0x18;
  uVar19 = uVar19 + uVar21;
  uVar32 = uVar32 ^ uVar19;
  uVar20 = uVar32 >> 7 | uVar32 << 0x19;
  uVar32 = uVar30 + iVar11 + uVar29;
  uVar34 = uVar34 ^ uVar32;
  uVar34 = uVar34 >> 0x10 | uVar34 << 0x10;
  uVar31 = uVar31 + uVar34;
  uVar29 = uVar29 ^ uVar31;
  uVar24 = uVar29 >> 0xc | uVar29 << 0x14;
  uVar30 = uVar32 + iVar12 + uVar24;
  uVar34 = uVar34 ^ uVar30;
  uVar29 = uVar34 >> 8 | uVar34 << 0x18;
  uVar31 = uVar31 + uVar29;
  uVar24 = uVar24 ^ uVar31;
  uVar34 = uVar24 >> 7 | uVar24 << 0x19;
  uVar22 = uVar22 + iVar13 + uVar27;
  uVar33 = uVar33 ^ uVar22;
  uVar33 = uVar33 >> 0x10 | uVar33 << 0x10;
  uVar28 = uVar28 + uVar33;
  uVar27 = uVar27 ^ uVar28;
  uVar24 = uVar27 >> 0xc | uVar27 << 0x14;
  uVar32 = uVar22 + iVar14 + uVar24;
  uVar33 = uVar33 ^ uVar32;
  uVar33 = uVar33 >> 8 | uVar33 << 0x18;
  uVar28 = uVar28 + uVar33;
  uVar24 = uVar24 ^ uVar28;
  uVar36 = uVar24 >> 7 | uVar24 << 0x19;
  uVar22 = uVar23 + iVar15 + uVar25;
  uVar18 = uVar18 ^ uVar22;
  uVar18 = uVar18 >> 0x10 | uVar18 << 0x10;
  uVar17 = uVar17 + uVar18;
  uVar25 = uVar25 ^ uVar17;
  uVar23 = uVar25 >> 0xc | uVar25 << 0x14;
  uVar24 = uVar22 + iVar16 + uVar23;
  uVar18 = uVar18 ^ uVar24;
  uVar27 = uVar18 >> 8 | uVar18 << 0x18;
  uVar17 = uVar17 + uVar27;
  uVar23 = uVar23 ^ uVar17;
  uVar23 = uVar23 >> 7 | uVar23 << 0x19;
  uVar18 = uVar26 + iVar2 + uVar23;
  uVar29 = uVar29 ^ uVar18;
  uVar22 = uVar29 >> 0x10 | uVar29 << 0x10;
  uVar28 = uVar28 + uVar22;
  uVar23 = uVar23 ^ uVar28;
  uVar23 = uVar23 >> 0xc | uVar23 << 0x14;
  uVar25 = uVar18 + iVar4 + uVar23;
  uVar22 = uVar22 ^ uVar25;
  uVar22 = uVar22 >> 8 | uVar22 << 0x18;
  uVar28 = uVar28 + uVar22;
  uVar23 = uVar23 ^ uVar28;
  uVar18 = uVar23 >> 7 | uVar23 << 0x19;
  uVar26 = uVar30 + iVar6 + uVar20;
  uVar33 = uVar33 ^ uVar26;
  uVar23 = uVar33 >> 0x10 | uVar33 << 0x10;
  uVar17 = uVar17 + uVar23;
  uVar20 = uVar20 ^ uVar17;
  uVar20 = uVar20 >> 0xc | uVar20 << 0x14;
  uVar30 = uVar26 + iVar11 + uVar20;
  uVar23 = uVar23 ^ uVar30;
  uVar33 = uVar23 >> 8 | uVar23 << 0x18;
  uVar17 = uVar17 + uVar33;
  uVar20 = uVar20 ^ uVar17;
  uVar29 = uVar20 >> 7 | uVar20 << 0x19;
  uVar20 = uVar32 + iVar8 + uVar34;
  uVar27 = uVar27 ^ uVar20;
  uVar32 = uVar27 >> 0x10 | uVar27 << 0x10;
  uVar19 = uVar19 + uVar32;
  uVar34 = uVar34 ^ uVar19;
  uVar26 = uVar34 >> 0xc | uVar34 << 0x14;
  uVar23 = uVar20 + iVar1 + uVar26;
  uVar32 = uVar32 ^ uVar23;
  uVar35 = uVar32 >> 8 | uVar32 << 0x18;
  uVar19 = uVar19 + uVar35;
  uVar26 = uVar26 ^ uVar19;
  uVar27 = uVar26 >> 7 | uVar26 << 0x19;
  uVar20 = uVar24 + iVar3 + uVar36;
  uVar21 = uVar21 ^ uVar20;
  uVar21 = uVar21 >> 0x10 | uVar21 << 0x10;
  uVar31 = uVar31 + uVar21;
  uVar36 = uVar36 ^ uVar31;
  uVar32 = uVar36 >> 0xc | uVar36 << 0x14;
  uVar26 = uVar20 + iVar14 + uVar32;
  uVar21 = uVar21 ^ uVar26;
  uVar20 = uVar21 >> 8 | uVar21 << 0x18;
  uVar31 = uVar31 + uVar20;
  uVar32 = uVar32 ^ uVar31;
  uVar34 = uVar32 >> 7 | uVar32 << 0x19;
  uVar21 = uVar25 + iVar5 + uVar29;
  uVar20 = uVar20 ^ uVar21;
  uVar20 = uVar20 >> 0x10 | uVar20 << 0x10;
  uVar19 = uVar19 + uVar20;
  uVar29 = uVar29 ^ uVar19;
  uVar24 = uVar29 >> 0xc | uVar29 << 0x14;
  uVar25 = uVar21 + iVar12 + uVar24;
  uVar20 = uVar20 ^ uVar25;
  uVar32 = uVar20 >> 8 | uVar20 << 0x18;
  uVar19 = uVar19 + uVar32;
  uVar24 = uVar24 ^ uVar19;
  uVar36 = uVar24 >> 7 | uVar24 << 0x19;
  uVar24 = uVar30 + iVar13 + uVar27;
  uVar22 = uVar22 ^ uVar24;
  uVar20 = uVar22 >> 0x10 | uVar22 << 0x10;
  uVar31 = uVar31 + uVar20;
  uVar27 = uVar27 ^ uVar31;
  uVar21 = uVar27 >> 0xc | uVar27 << 0x14;
  uVar30 = uVar24 + iVar7 + uVar21;
  uVar20 = uVar20 ^ uVar30;
  uVar27 = uVar20 >> 8 | uVar20 << 0x18;
  uVar31 = uVar31 + uVar27;
  uVar21 = uVar21 ^ uVar31;
  uVar20 = uVar21 >> 7 | uVar21 << 0x19;
  uVar22 = uVar23 + iVar10 + uVar34;
  uVar33 = uVar33 ^ uVar22;
  uVar21 = uVar33 >> 0x10 | uVar33 << 0x10;
  uVar28 = uVar28 + uVar21;
  uVar34 = uVar34 ^ uVar28;
  uVar23 = uVar34 >> 0xc | uVar34 << 0x14;
  uVar24 = uVar22 + iVar15 + uVar23;
  uVar21 = uVar21 ^ uVar24;
  uVar33 = uVar21 >> 8 | uVar21 << 0x18;
  uVar28 = uVar28 + uVar33;
  uVar23 = uVar23 ^ uVar28;
  uVar21 = uVar23 >> 7 | uVar23 << 0x19;
  uVar23 = uVar26 + iVar16 + uVar18;
  uVar35 = uVar35 ^ uVar23;
  uVar22 = uVar35 >> 0x10 | uVar35 << 0x10;
  uVar17 = uVar17 + uVar22;
  uVar18 = uVar18 ^ uVar17;
  uVar18 = uVar18 >> 0xc | uVar18 << 0x14;
  uVar26 = uVar23 + iVar9 + uVar18;
  uVar22 = uVar22 ^ uVar26;
  uVar29 = uVar22 >> 8 | uVar22 << 0x18;
  uVar17 = uVar17 + uVar29;
  uVar18 = uVar18 ^ uVar17;
  uVar18 = uVar18 >> 7 | uVar18 << 0x19;
  uVar22 = uVar25 + iVar6 + uVar18;
  uVar27 = uVar27 ^ uVar22;
  uVar23 = uVar27 >> 0x10 | uVar27 << 0x10;
  uVar28 = uVar28 + uVar23;
  uVar18 = uVar18 ^ uVar28;
  uVar18 = uVar18 >> 0xc | uVar18 << 0x14;
  uVar25 = uVar22 + iVar3 + uVar18;
  uVar23 = uVar23 ^ uVar25;
  uVar23 = uVar23 >> 8 | uVar23 << 0x18;
  uVar28 = uVar28 + uVar23;
  uVar18 = uVar18 ^ uVar28;
  uVar18 = uVar18 >> 7 | uVar18 << 0x19;
  uVar30 = uVar30 + iVar11 + uVar36;
  uVar33 = uVar33 ^ uVar30;
  uVar22 = uVar33 >> 0x10 | uVar33 << 0x10;
  uVar17 = uVar17 + uVar22;
  uVar36 = uVar36 ^ uVar17;
  uVar27 = uVar36 >> 0xc | uVar36 << 0x14;
  uVar33 = uVar30 + iVar13 + uVar27;
  uVar22 = uVar22 ^ uVar33;
  uVar36 = uVar22 >> 8 | uVar22 << 0x18;
  uVar17 = uVar17 + uVar36;
  uVar27 = uVar27 ^ uVar17;
  uVar30 = uVar27 >> 7 | uVar27 << 0x19;
  uVar24 = uVar24 + iVar14 + uVar20;
  uVar29 = uVar29 ^ uVar24;
  uVar22 = uVar29 >> 0x10 | uVar29 << 0x10;
  uVar19 = uVar19 + uVar22;
  uVar20 = uVar20 ^ uVar19;
  uVar20 = uVar20 >> 0xc | uVar20 << 0x14;
  uVar24 = uVar24 + iVar2 + uVar20;
  uVar22 = uVar22 ^ uVar24;
  uVar34 = uVar22 >> 8 | uVar22 << 0x18;
  uVar19 = uVar19 + uVar34;
  uVar20 = uVar20 ^ uVar19;
  uVar35 = uVar20 >> 7 | uVar20 << 0x19;
  uVar22 = uVar26 + iVar8 + uVar21;
  uVar32 = uVar32 ^ uVar22;
  uVar20 = uVar32 >> 0x10 | uVar32 << 0x10;
  uVar31 = uVar31 + uVar20;
  uVar21 = uVar21 ^ uVar31;
  uVar21 = uVar21 >> 0xc | uVar21 << 0x14;
  uVar26 = uVar22 + iVar15 + uVar21;
  uVar20 = uVar20 ^ uVar26;
  uVar20 = uVar20 >> 8 | uVar20 << 0x18;
  uVar31 = uVar31 + uVar20;
  uVar21 = uVar21 ^ uVar31;
  uVar27 = uVar21 >> 7 | uVar21 << 0x19;
  uVar21 = uVar25 + iVar4 + uVar30;
  uVar20 = uVar20 ^ uVar21;
  uVar20 = uVar20 >> 0x10 | uVar20 << 0x10;
  uVar19 = uVar19 + uVar20;
  uVar30 = uVar30 ^ uVar19;
  uVar32 = uVar30 >> 0xc | uVar30 << 0x14;
  uVar25 = uVar21 + iVar7 + uVar32;
  uVar20 = uVar20 ^ uVar25;
  uVar22 = uVar20 >> 8 | uVar20 << 0x18;
  uVar19 = uVar19 + uVar22;
  uVar32 = uVar32 ^ uVar19;
  uVar29 = uVar32 >> 7 | uVar32 << 0x19;
  uVar32 = uVar33 + iVar10 + uVar35;
  uVar23 = uVar23 ^ uVar32;
  uVar20 = uVar23 >> 0x10 | uVar23 << 0x10;
  uVar31 = uVar31 + uVar20;
  uVar35 = uVar35 ^ uVar31;
  uVar21 = uVar35 >> 0xc | uVar35 << 0x14;
  uVar33 = uVar32 + iVar1 + uVar21;
  uVar20 = uVar20 ^ uVar33;
  uVar35 = uVar20 >> 8 | uVar20 << 0x18;
  uVar31 = uVar31 + uVar35;
  uVar21 = uVar21 ^ uVar31;
  uVar20 = uVar21 >> 7 | uVar21 << 0x19;
  uVar32 = uVar24 + iVar12 + uVar27;
  uVar36 = uVar36 ^ uVar32;
  uVar21 = uVar36 >> 0x10 | uVar36 << 0x10;
  uVar28 = uVar28 + uVar21;
  uVar27 = uVar27 ^ uVar28;
  uVar23 = uVar27 >> 0xc | uVar27 << 0x14;
  uVar32 = uVar32 + iVar16 + uVar23;
  uVar21 = uVar21 ^ uVar32;
  uVar27 = uVar21 >> 8 | uVar21 << 0x18;
  uVar28 = uVar28 + uVar27;
  uVar23 = uVar23 ^ uVar28;
  uVar36 = uVar23 >> 7 | uVar23 << 0x19;
  uVar23 = uVar26 + iVar9 + uVar18;
  uVar34 = uVar34 ^ uVar23;
  uVar21 = uVar34 >> 0x10 | uVar34 << 0x10;
  uVar17 = uVar17 + uVar21;
  uVar18 = uVar18 ^ uVar17;
  uVar18 = uVar18 >> 0xc | uVar18 << 0x14;
  uVar24 = uVar23 + iVar5 + uVar18;
  uVar21 = uVar21 ^ uVar24;
  uVar30 = uVar21 >> 8 | uVar21 << 0x18;
  uVar17 = uVar17 + uVar30;
  uVar18 = uVar18 ^ uVar17;
  uVar18 = uVar18 >> 7 | uVar18 << 0x19;
  uVar21 = uVar25 + iVar11 + uVar18;
  uVar35 = uVar35 ^ uVar21;
  uVar23 = uVar35 >> 0x10 | uVar35 << 0x10;
  uVar28 = uVar28 + uVar23;
  uVar18 = uVar18 ^ uVar28;
  uVar18 = uVar18 >> 0xc | uVar18 << 0x14;
  uVar26 = uVar21 + iVar8 + uVar18;
  uVar23 = uVar23 ^ uVar26;
  uVar34 = uVar23 >> 8 | uVar23 << 0x18;
  uVar28 = uVar28 + uVar34;
  uVar18 = uVar18 ^ uVar28;
  uVar18 = uVar18 >> 7 | uVar18 << 0x19;
  uVar25 = uVar33 + iVar13 + uVar29;
  uVar27 = uVar27 ^ uVar25;
  uVar21 = uVar27 >> 0x10 | uVar27 << 0x10;
  uVar17 = uVar17 + uVar21;
  uVar29 = uVar29 ^ uVar17;
  uVar23 = uVar29 >> 0xc | uVar29 << 0x14;
  uVar33 = uVar25 + iVar10 + uVar23;
  uVar21 = uVar21 ^ uVar33;
  uVar25 = uVar21 >> 8 | uVar21 << 0x18;
  uVar17 = uVar17 + uVar25;
  uVar23 = uVar23 ^ uVar17;
  uVar29 = uVar23 >> 7 | uVar23 << 0x19;
  uVar32 = uVar32 + iVar15 + uVar20;
  uVar30 = uVar30 ^ uVar32;
  uVar21 = uVar30 >> 0x10 | uVar30 << 0x10;
  uVar19 = uVar19 + uVar21;
  uVar20 = uVar20 ^ uVar19;
  uVar20 = uVar20 >> 0xc | uVar20 << 0x14;
  uVar23 = uVar32 + iVar6 + uVar20;
  uVar21 = uVar21 ^ uVar23;
  uVar32 = uVar21 >> 8 | uVar21 << 0x18;
  uVar19 = uVar19 + uVar32;
  uVar20 = uVar20 ^ uVar19;
  uVar27 = uVar20 >> 7 | uVar20 << 0x19;
  uVar21 = uVar24 + iVar14 + uVar36;
  uVar22 = uVar22 ^ uVar21;
  uVar20 = uVar22 >> 0x10 | uVar22 << 0x10;
  uVar31 = uVar31 + uVar20;
  uVar36 = uVar36 ^ uVar31;
  uVar22 = uVar36 >> 0xc | uVar36 << 0x14;
  uVar24 = uVar21 + iVar16 + uVar22;
  uVar20 = uVar20 ^ uVar24;
  uVar20 = uVar20 >> 8 | uVar20 << 0x18;
  uVar31 = uVar31 + uVar20;
  uVar22 = uVar22 ^ uVar31;
  uVar35 = uVar22 >> 7 | uVar22 << 0x19;
  uVar21 = uVar26 + iVar3 + uVar29;
  uVar20 = uVar20 ^ uVar21;
  uVar20 = uVar20 >> 0x10 | uVar20 << 0x10;
  uVar19 = uVar19 + uVar20;
  uVar29 = uVar29 ^ uVar19;
  uVar29 = uVar29 >> 0xc | uVar29 << 0x14;
  uVar26 = uVar21 + iVar1 + uVar29;
  uVar20 = uVar20 ^ uVar26;
  uVar22 = uVar20 >> 8 | uVar20 << 0x18;
  uVar19 = uVar19 + uVar22;
  uVar29 = uVar29 ^ uVar19;
  uVar36 = uVar29 >> 7 | uVar29 << 0x19;
  uVar29 = uVar33 + iVar12 + uVar27;
  uVar34 = uVar34 ^ uVar29;
  uVar20 = uVar34 >> 0x10 | uVar34 << 0x10;
  uVar31 = uVar31 + uVar20;
  uVar27 = uVar27 ^ uVar31;
  uVar21 = uVar27 >> 0xc | uVar27 << 0x14;
  uVar30 = uVar29 + iVar2 + uVar21;
  uVar20 = uVar20 ^ uVar30;
  uVar27 = uVar20 >> 8 | uVar20 << 0x18;
  uVar31 = uVar31 + uVar27;
  uVar21 = uVar21 ^ uVar31;
  uVar20 = uVar21 >> 7 | uVar21 << 0x19;
  uVar23 = uVar23 + iVar7 + uVar35;
  uVar25 = uVar25 ^ uVar23;
  uVar21 = uVar25 >> 0x10 | uVar25 << 0x10;
  uVar28 = uVar28 + uVar21;
  uVar35 = uVar35 ^ uVar28;
  uVar25 = uVar35 >> 0xc | uVar35 << 0x14;
  uVar23 = uVar23 + iVar9 + uVar25;
  uVar21 = uVar21 ^ uVar23;
  uVar34 = uVar21 >> 8 | uVar21 << 0x18;
  uVar28 = uVar28 + uVar34;
  uVar25 = uVar25 ^ uVar28;
  uVar25 = uVar25 >> 7 | uVar25 << 0x19;
  uVar24 = uVar24 + iVar5 + uVar18;
  uVar32 = uVar32 ^ uVar24;
  uVar21 = uVar32 >> 0x10 | uVar32 << 0x10;
  uVar17 = uVar17 + uVar21;
  uVar18 = uVar18 ^ uVar17;
  uVar18 = uVar18 >> 0xc | uVar18 << 0x14;
  uVar24 = uVar24 + iVar4 + uVar18;
  uVar21 = uVar21 ^ uVar24;
  uVar29 = uVar21 >> 8 | uVar21 << 0x18;
  uVar17 = uVar17 + uVar29;
  uVar18 = uVar18 ^ uVar17;
  uVar18 = uVar18 >> 7 | uVar18 << 0x19;
  uVar21 = uVar26 + iVar13 + uVar18;
  uVar27 = uVar27 ^ uVar21;
  uVar32 = uVar27 >> 0x10 | uVar27 << 0x10;
  uVar28 = uVar28 + uVar32;
  uVar18 = uVar18 ^ uVar28;
  uVar18 = uVar18 >> 0xc | uVar18 << 0x14;
  uVar26 = uVar21 + iVar14 + uVar18;
  uVar32 = uVar32 ^ uVar26;
  uVar33 = uVar32 >> 8 | uVar32 << 0x18;
  uVar28 = uVar28 + uVar33;
  uVar18 = uVar18 ^ uVar28;
  uVar18 = uVar18 >> 7 | uVar18 << 0x19;
  uVar32 = uVar30 + iVar10 + uVar36;
  uVar34 = uVar34 ^ uVar32;
  uVar21 = uVar34 >> 0x10 | uVar34 << 0x10;
  uVar17 = uVar17 + uVar21;
  uVar36 = uVar36 ^ uVar17;
  uVar27 = uVar36 >> 0xc | uVar36 << 0x14;
  uVar30 = uVar32 + iVar12 + uVar27;
  uVar21 = uVar21 ^ uVar30;
  uVar32 = uVar21 >> 8 | uVar21 << 0x18;
  uVar17 = uVar17 + uVar32;
  uVar27 = uVar27 ^ uVar17;
  uVar27 = uVar27 >> 7 | uVar27 << 0x19;
  uVar23 = uVar23 + iVar16 + uVar20;
  uVar29 = uVar29 ^ uVar23;
  uVar21 = uVar29 >> 0x10 | uVar29 << 0x10;
  uVar19 = uVar19 + uVar21;
  uVar20 = uVar20 ^ uVar19;
  uVar20 = uVar20 >> 0xc | uVar20 << 0x14;
  uVar23 = uVar23 + iVar11 + uVar20;
  uVar21 = uVar21 ^ uVar23;
  uVar35 = uVar21 >> 8 | uVar21 << 0x18;
  uVar19 = uVar19 + uVar35;
  uVar20 = uVar20 ^ uVar19;
  uVar34 = uVar20 >> 7 | uVar20 << 0x19;
  uVar21 = uVar24 + iVar15 + uVar25;
  uVar22 = uVar22 ^ uVar21;
  uVar20 = uVar22 >> 0x10 | uVar22 << 0x10;
  uVar31 = uVar31 + uVar20;
  uVar25 = uVar25 ^ uVar31;
  uVar22 = uVar25 >> 0xc | uVar25 << 0x14;
  uVar24 = uVar21 + iVar9 + uVar22;
  uVar20 = uVar20 ^ uVar24;
  uVar20 = uVar20 >> 8 | uVar20 << 0x18;
  uVar31 = uVar31 + uVar20;
  uVar22 = uVar22 ^ uVar31;
  uVar25 = uVar22 >> 7 | uVar22 << 0x19;
  uVar21 = uVar26 + iVar8 + uVar27;
  uVar20 = uVar20 ^ uVar21;
  uVar20 = uVar20 >> 0x10 | uVar20 << 0x10;
  uVar19 = uVar19 + uVar20;
  uVar27 = uVar27 ^ uVar19;
  uVar29 = uVar27 >> 0xc | uVar27 << 0x14;
  uVar26 = uVar21 + iVar2 + uVar29;
  uVar20 = uVar20 ^ uVar26;
  uVar22 = uVar20 >> 8 | uVar20 << 0x18;
  uVar19 = uVar19 + uVar22;
  uVar29 = uVar29 ^ uVar19;
  uVar27 = uVar29 >> 7 | uVar29 << 0x19;
  uVar29 = uVar30 + iVar7 + uVar34;
  uVar33 = uVar33 ^ uVar29;
  uVar20 = uVar33 >> 0x10 | uVar33 << 0x10;
  uVar31 = uVar31 + uVar20;
  uVar34 = uVar34 ^ uVar31;
  uVar21 = uVar34 >> 0xc | uVar34 << 0x14;
  uVar30 = uVar29 + iVar6 + uVar21;
  uVar20 = uVar20 ^ uVar30;
  uVar33 = uVar20 >> 8 | uVar20 << 0x18;
  uVar31 = uVar31 + uVar33;
  uVar21 = uVar21 ^ uVar31;
  uVar34 = uVar21 >> 7 | uVar21 << 0x19;
  uVar21 = uVar23 + iVar1 + uVar25;
  uVar32 = uVar32 ^ uVar21;
  uVar20 = uVar32 >> 0x10 | uVar32 << 0x10;
  uVar28 = uVar28 + uVar20;
  uVar25 = uVar25 ^ uVar28;
  uVar23 = uVar25 >> 0xc | uVar25 << 0x14;
  uVar32 = uVar21 + iVar5 + uVar23;
  uVar20 = uVar20 ^ uVar32;
  uVar25 = uVar20 >> 8 | uVar20 << 0x18;
  uVar28 = uVar28 + uVar25;
  uVar23 = uVar23 ^ uVar28;
  uVar20 = uVar23 >> 7 | uVar23 << 0x19;
  uVar23 = uVar24 + iVar4 + uVar18;
  uVar35 = uVar35 ^ uVar23;
  uVar21 = uVar35 >> 0x10 | uVar35 << 0x10;
  uVar17 = uVar17 + uVar21;
  uVar18 = uVar18 ^ uVar17;
  uVar18 = uVar18 >> 0xc | uVar18 << 0x14;
  uVar23 = uVar23 + iVar3 + uVar18;
  uVar21 = uVar21 ^ uVar23;
  uVar29 = uVar21 >> 8 | uVar21 << 0x18;
  uVar17 = uVar17 + uVar29;
  uVar18 = uVar18 ^ uVar17;
  uVar18 = uVar18 >> 7 | uVar18 << 0x19;
  uVar21 = uVar26 + iVar10 + uVar18;
  uVar33 = uVar33 ^ uVar21;
  uVar35 = uVar33 >> 0x10 | uVar33 << 0x10;
  uVar28 = uVar28 + uVar35;
  uVar18 = uVar18 ^ uVar28;
  uVar33 = uVar18 >> 0xc | uVar18 << 0x14;
  uVar24 = uVar21 + iVar15 + uVar33;
  uVar35 = uVar35 ^ uVar24;
  uVar21 = uVar30 + iVar12 + uVar27;
  uVar25 = uVar25 ^ uVar21;
  uVar18 = uVar25 >> 0x10 | uVar25 << 0x10;
  uVar17 = uVar17 + uVar18;
  uVar27 = uVar27 ^ uVar17;
  uVar26 = uVar27 >> 0xc | uVar27 << 0x14;
  uVar27 = uVar21 + iVar7 + uVar26;
  uVar18 = uVar18 ^ uVar27;
  uVar21 = uVar18 >> 8 | uVar18 << 0x18;
  uVar17 = uVar17 + uVar21;
  uVar26 = uVar26 ^ uVar17;
  uVar25 = uVar26 >> 7 | uVar26 << 0x19;
  uVar32 = uVar32 + iVar9 + uVar34;
  uVar29 = uVar29 ^ uVar32;
  uVar18 = uVar29 >> 0x10 | uVar29 << 0x10;
  uVar19 = uVar19 + uVar18;
  uVar34 = uVar34 ^ uVar19;
  uVar26 = uVar34 >> 0xc | uVar34 << 0x14;
  uVar34 = uVar32 + iVar13 + uVar26;
  uVar18 = uVar18 ^ uVar34;
  uVar30 = uVar18 >> 8 | uVar18 << 0x18;
  uVar19 = uVar19 + uVar30;
  uVar26 = uVar26 ^ uVar19;
  uVar32 = uVar23 + iVar16 + uVar20;
  uVar22 = uVar22 ^ uVar32;
  uVar18 = uVar22 >> 0x10 | uVar22 << 0x10;
  uVar31 = uVar31 + uVar18;
  uVar20 = uVar20 ^ uVar31;
  uVar20 = uVar20 >> 0xc | uVar20 << 0x14;
  uVar32 = uVar32 + iVar5 + uVar20;
  uVar18 = uVar18 ^ uVar32;
  uVar18 = uVar18 >> 8 | uVar18 << 0x18;
  uVar31 = uVar31 + uVar18;
  uVar22 = uVar24 + iVar14 + uVar25;
  uVar18 = uVar18 ^ uVar22;
  uVar24 = uVar18 >> 0x10 | uVar18 << 0x10;
  uVar19 = uVar19 + uVar24;
  uVar25 = uVar25 ^ uVar19;
  uVar36 = uVar25 >> 0xc | uVar25 << 0x14;
  uVar23 = uVar22 + iVar6 + uVar36;
  uVar24 = uVar24 ^ uVar23;
  uVar18 = uVar35 >> 8 | uVar35 << 0x18;
  uVar28 = uVar28 + uVar18;
  uVar33 = uVar33 ^ uVar28;
  uVar25 = uVar33 >> 7 | uVar33 << 0x19;
  uVar22 = uVar26 >> 7 | uVar26 << 0x19;
  uVar20 = uVar20 ^ uVar31;
  uVar26 = uVar27 + iVar1 + uVar22;
  uVar18 = uVar18 ^ uVar26;
  uVar18 = uVar18 >> 0x10 | uVar18 << 0x10;
  uVar31 = uVar31 + uVar18;
  uVar22 = uVar22 ^ uVar31;
  uVar22 = uVar22 >> 0xc | uVar22 << 0x14;
  uVar29 = uVar26 + iVar11 + uVar22;
  uVar18 = uVar18 ^ uVar29;
  uVar27 = uVar18 >> 8 | uVar18 << 0x18;
  uVar31 = uVar31 + uVar27;
  uVar32 = uVar32 + iVar3 + uVar25;
  uVar30 = uVar30 ^ uVar32;
  uVar18 = uVar30 >> 0x10 | uVar30 << 0x10;
  uVar17 = uVar17 + uVar18;
  uVar25 = uVar25 ^ uVar17;
  uVar26 = uVar25 >> 0xc | uVar25 << 0x14;
  uVar32 = uVar32 + iVar8 + uVar26;
  uVar18 = uVar18 ^ uVar32;
  uVar18 = uVar18 >> 8 | uVar18 << 0x18;
  uVar17 = uVar17 + uVar18;
  uVar26 = uVar26 ^ uVar17;
  uVar26 = uVar26 >> 7 | uVar26 << 0x19;
  uVar23 = uVar23 + iVar12 + uVar26;
  uVar27 = uVar27 ^ uVar23;
  uVar20 = uVar20 >> 7 | uVar20 << 0x19;
  uVar24 = uVar24 >> 8 | uVar24 << 0x18;
  uVar19 = uVar19 + uVar24;
  uVar36 = uVar36 ^ uVar19;
  uVar33 = uVar36 >> 7 | uVar36 << 0x19;
  uVar25 = uVar34 + iVar2 + uVar20;
  uVar21 = uVar21 ^ uVar25;
  uVar21 = uVar21 >> 0x10 | uVar21 << 0x10;
  uVar28 = uVar28 + uVar21;
  uVar20 = uVar20 ^ uVar28;
  uVar20 = uVar20 >> 0xc | uVar20 << 0x14;
  uVar25 = uVar25 + iVar4 + uVar20;
  uVar21 = uVar21 ^ uVar25;
  uVar21 = uVar21 >> 8 | uVar21 << 0x18;
  uVar28 = uVar28 + uVar21;
  uVar29 = uVar29 + iVar7 + uVar33;
  uVar21 = uVar21 ^ uVar29;
  uVar22 = uVar22 ^ uVar31;
  uVar22 = uVar22 >> 7 | uVar22 << 0x19;
  uVar30 = uVar25 + iVar5 + uVar22;
  uVar18 = uVar18 ^ uVar30;
  uVar20 = uVar20 ^ uVar28;
  uVar25 = uVar20 >> 7 | uVar20 << 0x19;
  uVar32 = uVar32 + iVar9 + uVar25;
  uVar24 = uVar24 ^ uVar32;
  uVar27 = uVar27 >> 0x10 | uVar27 << 0x10;
  uVar28 = uVar28 + uVar27;
  uVar26 = uVar26 ^ uVar28;
  uVar20 = uVar26 >> 0xc | uVar26 << 0x14;
  uVar23 = uVar23 + iVar16 + uVar20;
  uVar27 = uVar27 ^ uVar23;
  uVar21 = uVar21 >> 0x10 | uVar21 << 0x10;
  uVar17 = uVar17 + uVar21;
  uVar33 = uVar33 ^ uVar17;
  uVar26 = uVar33 >> 0xc | uVar33 << 0x14;
  uVar29 = uVar29 + iVar1 + uVar26;
  uVar21 = uVar21 ^ uVar29;
  uVar33 = uVar21 >> 8 | uVar21 << 0x18;
  uVar17 = uVar17 + uVar33;
  uVar26 = uVar26 ^ uVar17;
  uVar26 = uVar26 >> 7 | uVar26 << 0x19;
  uVar21 = uVar24 >> 0x10 | uVar24 << 0x10;
  uVar31 = uVar31 + uVar21;
  uVar25 = uVar25 ^ uVar31;
  uVar25 = uVar25 >> 0xc | uVar25 << 0x14;
  uVar32 = uVar32 + iVar4 + uVar25;
  uVar21 = uVar21 ^ uVar32;
  uVar24 = uVar21 >> 8 | uVar21 << 0x18;
  uVar31 = uVar31 + uVar24;
  uVar21 = uVar23 + iVar15 + uVar26;
  uVar24 = uVar24 ^ uVar21;
  uVar23 = uVar18 >> 0x10 | uVar18 << 0x10;
  uVar19 = uVar19 + uVar23;
  uVar22 = uVar22 ^ uVar19;
  uVar35 = uVar22 >> 0xc | uVar22 << 0x14;
  uVar22 = uVar30 + iVar10 + uVar35;
  uVar23 = uVar23 ^ uVar22;
  uVar25 = uVar25 ^ uVar31;
  uVar18 = uVar25 >> 7 | uVar25 << 0x19;
  uVar34 = uVar22 + iVar6 + uVar18;
  uVar33 = uVar33 ^ uVar34;
  uVar27 = uVar27 >> 8 | uVar27 << 0x18;
  uVar28 = uVar28 + uVar27;
  uVar20 = uVar20 ^ uVar28;
  uVar25 = uVar23 >> 8 | uVar23 << 0x18;
  uVar19 = uVar19 + uVar25;
  uVar35 = uVar35 ^ uVar19;
  uVar30 = uVar24 >> 0x10 | uVar24 << 0x10;
  uVar19 = uVar19 + uVar30;
  uVar26 = uVar26 ^ uVar19;
  uVar22 = uVar26 >> 0xc | uVar26 << 0x14;
  uVar21 = uVar21 + iVar11 + uVar22;
  uVar30 = uVar30 ^ uVar21;
  uVar23 = uVar33 >> 0x10 | uVar33 << 0x10;
  uVar28 = uVar28 + uVar23;
  uVar18 = uVar18 ^ uVar28;
  uVar18 = uVar18 >> 0xc | uVar18 << 0x14;
  uVar24 = uVar34 + iVar3 + uVar18;
  uVar23 = uVar23 ^ uVar24;
  uVar33 = uVar23 >> 8 | uVar23 << 0x18;
  uVar28 = uVar28 + uVar33;
  uVar21 = uVar21 ^ uVar28;
  *out = (uint8_t)uVar21;
  out[1] = (uint8_t)(uVar21 >> 8);
  out[2] = (uint8_t)(uVar21 >> 0x10);
  out[3] = (uint8_t)(uVar21 >> 0x18);
  uVar21 = uVar35 >> 7 | uVar35 << 0x19;
  uVar23 = uVar29 + iVar2 + uVar21;
  uVar27 = uVar27 ^ uVar23;
  uVar26 = uVar20 >> 7 | uVar20 << 0x19;
  uVar32 = uVar32 + iVar8 + uVar26;
  uVar25 = uVar25 ^ uVar32;
  uVar29 = uVar27 >> 0x10 | uVar27 << 0x10;
  uVar31 = uVar31 + uVar29;
  uVar21 = uVar21 ^ uVar31;
  uVar27 = uVar21 >> 0xc | uVar21 << 0x14;
  uVar23 = uVar23 + iVar13 + uVar27;
  uVar29 = uVar29 ^ uVar23;
  uVar20 = uVar25 >> 0x10 | uVar25 << 0x10;
  uVar17 = uVar17 + uVar20;
  uVar26 = uVar26 ^ uVar17;
  uVar26 = uVar26 >> 0xc | uVar26 << 0x14;
  uVar21 = uVar32 + iVar14 + uVar26;
  uVar20 = uVar20 ^ uVar21;
  uVar20 = uVar20 >> 8 | uVar20 << 0x18;
  uVar17 = uVar17 + uVar20;
  uVar23 = uVar23 ^ uVar17;
  out[4] = (uint8_t)uVar23;
  out[5] = (uint8_t)(uVar23 >> 8);
  out[6] = (uint8_t)(uVar23 >> 0x10);
  out[7] = (uint8_t)(uVar23 >> 0x18);
  uVar32 = uVar30 >> 8 | uVar30 << 0x18;
  uVar19 = uVar19 + uVar32;
  uVar24 = uVar24 ^ uVar19;
  out[8] = (uint8_t)uVar24;
  out[9] = (uint8_t)(uVar24 >> 8);
  out[10] = (uint8_t)(uVar24 >> 0x10);
  out[0xb] = (uint8_t)(uVar24 >> 0x18);
  uVar23 = uVar29 >> 8 | uVar29 << 0x18;
  uVar31 = uVar31 + uVar23;
  uVar21 = uVar21 ^ uVar31;
  out[0xc] = (uint8_t)uVar21;
  out[0xd] = (uint8_t)(uVar21 >> 8);
  out[0xe] = (uint8_t)(uVar21 >> 0x10);
  uVar26 = uVar26 ^ uVar17;
  out[0xf] = (uint8_t)(uVar21 >> 0x18);
  uVar21 = (uVar26 >> 7 | uVar26 << 0x19) ^ uVar23;
  out[0x10] = (uint8_t)uVar21;
  out[0x11] = (uint8_t)(uVar21 >> 8);
  out[0x12] = (uint8_t)(uVar21 >> 0x10);
  uVar22 = uVar22 ^ uVar19;
  out[0x13] = (uint8_t)(uVar21 >> 0x18);
  uVar21 = (uVar22 >> 7 | uVar22 << 0x19) ^ uVar33;
  out[0x14] = (uint8_t)uVar21;
  out[0x15] = (uint8_t)(uVar21 >> 8);
  out[0x16] = (uint8_t)(uVar21 >> 0x10);
  uVar27 = uVar27 ^ uVar31;
  out[0x17] = (uint8_t)(uVar21 >> 0x18);
  uVar21 = (uVar27 >> 7 | uVar27 << 0x19) ^ uVar20;
  out[0x18] = (uint8_t)uVar21;
  out[0x19] = (uint8_t)(uVar21 >> 8);
  out[0x1a] = (uint8_t)(uVar21 >> 0x10);
  uVar18 = uVar18 ^ uVar28;
  out[0x1b] = (uint8_t)(uVar21 >> 0x18);
  uVar18 = (uVar18 >> 7 | uVar18 << 0x19) ^ uVar32;
  out[0x1c] = (uint8_t)uVar18;
  out[0x1d] = (uint8_t)(uVar18 >> 8);
  out[0x1e] = (uint8_t)(uVar18 >> 0x10);
  out[0x1f] = (uint8_t)(uVar18 >> 0x18);
  *(uint *)(out + 0x20) = uVar28 ^ *cv;
  *(uint *)(out + 0x24) = uVar17 ^ cv[1];
  *(uint *)(out + 0x28) = uVar19 ^ cv[2];
  *(uint *)(out + 0x2c) = uVar31 ^ cv[3];
  *(uint *)(out + 0x30) = uVar23 ^ cv[4];
  *(uint *)(out + 0x34) = uVar33 ^ cv[5];
  *(uint *)(out + 0x38) = uVar20 ^ cv[6];
  *(uint *)(out + 0x3c) = uVar32 ^ cv[7];
  return;
}

Assistant:

void blake3_compress_xof_portable(const uint32_t cv[8],
                                  const uint8_t block[BLAKE3_BLOCK_LEN],
                                  uint8_t block_len, uint64_t counter,
                                  uint8_t flags, uint8_t out[64]) {
  uint32_t state[16];
  compress_pre(state, cv, block, block_len, counter, flags);

  store32(&out[0 * 4], state[0] ^ state[8]);
  store32(&out[1 * 4], state[1] ^ state[9]);
  store32(&out[2 * 4], state[2] ^ state[10]);
  store32(&out[3 * 4], state[3] ^ state[11]);
  store32(&out[4 * 4], state[4] ^ state[12]);
  store32(&out[5 * 4], state[5] ^ state[13]);
  store32(&out[6 * 4], state[6] ^ state[14]);
  store32(&out[7 * 4], state[7] ^ state[15]);
  store32(&out[8 * 4], state[8] ^ cv[0]);
  store32(&out[9 * 4], state[9] ^ cv[1]);
  store32(&out[10 * 4], state[10] ^ cv[2]);
  store32(&out[11 * 4], state[11] ^ cv[3]);
  store32(&out[12 * 4], state[12] ^ cv[4]);
  store32(&out[13 * 4], state[13] ^ cv[5]);
  store32(&out[14 * 4], state[14] ^ cv[6]);
  store32(&out[15 * 4], state[15] ^ cv[7]);
}